

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManPerformMappingInt(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGia_00;
  Lf_Man_t *p;
  FILE *__stream;
  Gia_Man_t *p_00;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  word *pwVar12;
  char pFileName [1000];
  char local_418 [1000];
  
  if (pPars->fUseMux7 != 0) {
    pPars->fCoarsen = 1;
    pPars->nRoundsEla = 0;
  }
  if ((pGia->pSibls != (int *)0x0) || (pPars->nLutSizeMux != 0)) {
    pPars->fCutMin = 1;
  }
  pGia_00 = pGia;
  if (pPars->fCoarsen != 0) {
    pGia_00 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    pGia_00->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
  }
  p = Lf_ManAlloc(pGia_00,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGia_00);
    putchar(10);
  }
  Lf_ManPrintInit(p);
  p->Iter = 0;
  iVar6 = p->pPars->nRounds;
  if (iVar6 < 1) {
    iVar5 = 0;
  }
  else {
    do {
      Lf_ManComputeMapping(p);
      iVar5 = p->Iter + 1;
      p->Iter = iVar5;
      iVar6 = p->pPars->nRounds;
    } while (iVar5 < iVar6);
  }
  p->fUseEla = 1;
  if (iVar5 < iVar6 + pPars->nRoundsEla) {
    do {
      Lf_ManComputeMapping(p);
      iVar6 = p->Iter + 1;
      p->Iter = iVar6;
    } while (iVar6 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    pVVar2 = p->vTtMem;
    pcVar3 = p->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar3);
    __stream = _stdout;
    if ((pcVar3 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar2->nEntries);
    }
    uVar9 = (ulong)(uint)pVVar2->nEntries;
    if ((0 < pVVar2->nEntries) && (pwVar12 = *pVVar2->ppPages, pwVar12 != (word *)0x0)) {
      uVar8 = pVVar2->nEntrySize;
      uVar10 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar9 = (ulong)uVar8;
          do {
            lVar11 = 0x3c;
            do {
              uVar8 = (uint)(pwVar12[uVar9 - 1] >> ((byte)lVar11 & 0x3f)) & 0xf;
              if (uVar8 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar8 + 0x37,__stream);
              }
              lVar11 = lVar11 + -4;
            } while (lVar11 != -4);
            bVar4 = 1 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar4);
        }
        fputc(10,__stream);
        uVar10 = uVar10 + 1;
        uVar9 = (ulong)(uint)pVVar2->nEntries;
        if (pVVar2->nEntries <= (int)uVar10) break;
        uVar8 = pVVar2->nEntrySize;
        pwVar12 = pVVar2->ppPages[uVar10 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                  (int)((pVVar2->PageMask & uVar10) * uVar8);
      } while (pVVar2->ppPages[uVar10 >> ((byte)pVVar2->LogPageSze & 0x1f)] != (word *)0x0);
    }
    if (__stream != _stdout) {
      fclose(__stream);
      uVar9 = (ulong)(uint)pVVar2->nEntries;
    }
    pcVar7 = local_418;
    if (pcVar3 == (char *)0x0) {
      pcVar7 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar2->nEntrySize * (double)(int)uVar9 * 8.0 * 9.5367431640625e-07,uVar9,
           (ulong)uVar1,pcVar7);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_00 = Lf_ManDeriveMapping(p);
    }
    else {
      p_00 = Lf_ManDeriveMappingCoarse(p);
    }
  }
  else {
    p_00 = Lf_ManDeriveMappingGia(p);
  }
  Gia_ManMappingVerify(p_00);
  Lf_ManPrintQuit(p,p_00);
  Lf_ManFree(p);
  if (pGia_00 != pGia) {
    pGia->pManTime = pGia_00->pManTime;
    pGia_00->pManTime = (void *)0x0;
    Gia_ManStop(pGia_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Lf_ManPerformMappingInt( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    int fUsePowerMode = 0;
    Lf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fUseMux7 )
        pPars->fCoarsen = 1, pPars->nRoundsEla = 0;
    if ( Gia_ManHasChoices(pGia) || pPars->nLutSizeMux )
        pPars->fCutMin = 1; 
    if ( pPars->fCoarsen )
    {
        pCls = Gia_ManDupMuxes(pGia, pPars->nCoarseLimit);
        pCls->pManTime = pGia->pManTime; pGia->pManTime = NULL;
    }
    else pCls = pGia;
    p = Lf_ManAlloc( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Lf_ManPrintInit( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
        pPars->fPower = 0;

    // perform mapping
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        Lf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Lf_ManComputeMapping( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
    {
        pPars->fPower = 1;
        for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla + 2; p->Iter++ )
            Lf_ManComputeMapping( p );
    }

    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Lf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Lf_ManDeriveMappingCoarse( p );
    else
        pNew = Lf_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    Lf_ManPrintQuit( p, pNew );
    Lf_ManFree( p );
    if ( pCls != pGia )
    {
        pGia->pManTime = pCls->pManTime; pCls->pManTime = NULL;
        Gia_ManStop( pCls );
    }
    return pNew;
}